

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandUndc(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Cex_t *p;
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Abc_Ntk_t *pNtk_00;
  Abc_Cex_t *pAVar6;
  char *pcVar7;
  int local_50;
  int local_4c;
  int nFlopsX;
  int k;
  Abc_Cex_t *pTemp;
  char *pInit;
  int fUseCex;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  bVar1 = false;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"ch"), iVar2 != -1) {
    if (iVar2 != 99) {
      Abc_Print(-2,"usage: undc [-ch]\n");
      Abc_Print(-2,"\t        converts latches with DC init values into free PIs\n");
      pcVar7 = "no";
      if (bVar1) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,
                "\t-c    : toggles transforming CEX after \"logic;undc;st;zero\" [default = %s]\n",
                pcVar7);
      Abc_Print(-2,"\t-h    : print the command usage\n");
      return 1;
    }
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if (pNtk_00 == (Abc_Ntk_t *)0x0) {
    Abc_Print(-1,"Empty network.\n");
    pAbc_local._4_4_ = 1;
  }
  else if (bVar1) {
    local_50 = 0;
    if (pAbc->pCex == (Abc_Cex_t *)0x0) {
      Abc_Print(-1,"Current CEX is not available.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      pcVar7 = Abc_NtkCollectLatchValuesStr(pAbc->pNtkCur);
      for (local_4c = 0; iVar2 = Abc_NtkLatchNum(pAbc->pNtkCur), local_4c < iVar2;
          local_4c = local_4c + 1) {
        local_50 = (uint)(pcVar7[local_4c] == 'x') + local_50;
      }
      iVar2 = Abc_NtkPiNum(pNtk_00);
      if (iVar2 + local_50 == pAbc->pCex->nPis) {
        p = pAbc->pCex;
        pAVar6 = Abc_CexTransformUndc(p,pcVar7);
        pAbc->pCex = pAVar6;
        iVar2 = pAbc->pCex->nPis;
        iVar5 = Abc_NtkPiNum(pAbc->pNtkCur);
        if (iVar2 != iVar5) {
          __assert_fail("pAbc->pCex->nPis == Abc_NtkPiNum(pAbc->pNtkCur)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abc.c"
                        ,0x4ecb,"int Abc_CommandUndc(Abc_Frame_t *, int, char **)");
        }
        iVar2 = pAbc->pCex->nRegs;
        iVar5 = Abc_NtkLatchNum(pAbc->pNtkCur);
        if (iVar2 != iVar5) {
          __assert_fail("pAbc->pCex->nRegs == Abc_NtkLatchNum(pAbc->pNtkCur)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abc.c"
                        ,0x4ecc,"int Abc_CommandUndc(Abc_Frame_t *, int, char **)");
        }
        Abc_CexFree(p);
        if (pcVar7 != (char *)0x0) {
          free(pcVar7);
        }
        pAbc_local._4_4_ = 0;
      }
      else {
        uVar3 = Abc_NtkPiNum(pNtk_00);
        uVar4 = Abc_NtkLatchNum(pNtk_00);
        Abc_Print(-1,
                  "The number of PIs (%d) plus X-valued flops (%d) in the original network does not match the number of PIs in the current CEX (%d).\n"
                  ,(ulong)uVar3,(ulong)uVar4,(ulong)(uint)pAbc->pCex->nPis);
        pAbc_local._4_4_ = 1;
      }
    }
  }
  else {
    iVar2 = Abc_NtkIsComb(pNtk_00);
    if (iVar2 == 0) {
      iVar2 = Abc_NtkIsLogic(pNtk_00);
      if (iVar2 == 0) {
        Abc_Print(-1,"This command works only for logic networks.\n");
        pAbc_local._4_4_ = 0;
      }
      else {
        Abc_NtkConvertDcLatches(pNtk_00);
        pAbc_local._4_4_ = 0;
      }
    }
    else {
      Abc_Print(0,"The current network is combinational.\n");
      pAbc_local._4_4_ = 0;
    }
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandUndc( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c, fUseCex = 0;
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ch" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fUseCex ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( fUseCex )
    {
        char * pInit;
        Abc_Cex_t * pTemp;
        int k, nFlopsX = 0;
        if ( pAbc->pCex == NULL )
        {
            Abc_Print( -1, "Current CEX is not available.\n" );
            return 1;
        }
        pInit = Abc_NtkCollectLatchValuesStr( pAbc->pNtkCur );
        // count the number of X-valued flops
        for ( k = 0; k < Abc_NtkLatchNum(pAbc->pNtkCur); k++ )
            nFlopsX += (int)(pInit[k] == 'x');
        // compare this value
        if ( Abc_NtkPiNum(pNtk) + nFlopsX != pAbc->pCex->nPis )
        {
            Abc_Print( -1, "The number of PIs (%d) plus X-valued flops (%d) in the original network does not match the number of PIs in the current CEX (%d).\n",
                Abc_NtkPiNum(pNtk), Abc_NtkLatchNum(pNtk), pAbc->pCex->nPis );
            return 1;
        }
        pAbc->pCex = Abc_CexTransformUndc( pTemp = pAbc->pCex, pInit );
        assert( pAbc->pCex->nPis == Abc_NtkPiNum(pAbc->pNtkCur) );
        assert( pAbc->pCex->nRegs == Abc_NtkLatchNum(pAbc->pNtkCur) );
        Abc_CexFree( pTemp );
        ABC_FREE( pInit );
        return 0;
    }

    if ( Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( 0, "The current network is combinational.\n" );
        return 0;
    }

    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command works only for logic networks.\n" );
        return 0;
    }

    // get the new network
    Abc_NtkConvertDcLatches( pNtk );
    return 0;

usage:
    Abc_Print( -2, "usage: undc [-ch]\n" );
    Abc_Print( -2, "\t        converts latches with DC init values into free PIs\n" );
    Abc_Print( -2, "\t-c    : toggles transforming CEX after \"logic;undc;st;zero\" [default = %s]\n", fUseCex? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}